

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O0

int __thiscall QList<Qt::DayOfWeek>::remove(QList<Qt::DayOfWeek> *this,char *__filename)

{
  QList<Qt::DayOfWeek> *extraout_RAX;
  long in_RDX;
  qsizetype in_stack_00000010;
  DayOfWeek *in_stack_00000018;
  QPodArrayOps<Qt::DayOfWeek> *in_stack_00000020;
  QArrayDataPointer<Qt::DayOfWeek> *in_stack_ffffffffffffffd8;
  
  if (in_RDX != 0) {
    QArrayDataPointer<Qt::DayOfWeek>::detach(&this->d,in_stack_ffffffffffffffd8);
    QArrayDataPointer<Qt::DayOfWeek>::operator->(&this->d);
    QArrayDataPointer<Qt::DayOfWeek>::operator->(&this->d);
    QArrayDataPointer<Qt::DayOfWeek>::begin((QArrayDataPointer<Qt::DayOfWeek> *)0x4f3909);
    QtPrivate::QPodArrayOps<Qt::DayOfWeek>::erase
              (in_stack_00000020,in_stack_00000018,in_stack_00000010);
    this = extraout_RAX;
  }
  return (int)this;
}

Assistant:

inline void QList<T>::remove(qsizetype i, qsizetype n)
{
    Q_ASSERT_X(size_t(i) + size_t(n) <= size_t(d->size), "QList::remove", "index out of range");
    Q_ASSERT_X(n >= 0, "QList::remove", "invalid count");

    if (n == 0)
        return;

    d.detach();
    d->erase(d->begin() + i, n);
}